

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Combine<duckdb::ArgMinMaxState<short,double>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<short,_double> *source,ArgMinMaxState<short,_double> *target,
               AggregateInputData *param_3)

{
  bool bVar1;
  double *in_RDX;
  double *in_RSI;
  byte *in_RDI;
  
  if (((*in_RDI & 1) != 0) &&
     ((((ulong)*in_RSI & 1) == 0 || (bVar1 = LessThan::Operation<double>(in_RSI,in_RDX), bVar1)))) {
    Assign<short,double,duckdb::ArgMinMaxState<short,double>>
              ((ArgMinMaxState<short,_double> *)param_3,(short *)in_RDI,in_RSI,
               SUB81((ulong)in_RDX >> 0x38,0));
    *(undefined1 *)in_RSI = 1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}